

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

xmlChar * xmlSplitQName(xmlParserCtxtPtr ctxt,xmlChar *name,xmlChar **prefixOut)

{
  long lVar1;
  byte bVar2;
  int iVar3;
  xmlChar *pxVar4;
  xmlChar *pxVar5;
  xmlChar *pxVar6;
  uint uVar7;
  byte *cur;
  uint uVar8;
  size_t sVar9;
  ulong uVar10;
  size_t __n;
  int l;
  xmlChar buf [105];
  
  if (prefixOut == (xmlChar **)0x0) {
    return (xmlChar *)0x0;
  }
  *prefixOut = (xmlChar *)0x0;
  if (name == (xmlChar *)0x0) {
    return (xmlChar *)0x0;
  }
  bVar2 = *name;
  if (bVar2 == 0x3a) {
LAB_0013005f:
    pxVar4 = xmlStrdup(name);
    return pxVar4;
  }
  uVar10 = 0;
  while ((bVar2 != 0 && (bVar2 != 0x3a))) {
    if (uVar10 == 100) {
      __n = 100;
      goto LAB_001300c8;
    }
    buf[uVar10] = bVar2;
    lVar1 = uVar10 + 1;
    uVar10 = uVar10 + 1;
    bVar2 = name[lVar1];
  }
  if (uVar10 < 100) {
    cur = name + uVar10 + 1;
    uVar7 = 100;
    pxVar4 = (xmlChar *)0x0;
  }
  else {
    __n = uVar10 & 0xffffffff;
LAB_001300c8:
    sVar9 = (size_t)(uint)((int)__n * 2);
    pxVar4 = (xmlChar *)(*xmlMalloc)(sVar9);
    if (pxVar4 == (xmlChar *)0x0) goto LAB_00130269;
    cur = name + uVar10;
    memcpy(pxVar4,buf,__n);
    while( true ) {
      uVar7 = (uint)sVar9;
      cur = cur + 1;
      if ((bVar2 == 0) || (bVar2 == 0x3a)) break;
      pxVar5 = pxVar4;
      if ((int)uVar7 < (int)__n + 10) {
        sVar9 = 1;
        if (0 < (int)uVar7) {
          if (999999999 < uVar7) goto LAB_001302d9;
          uVar8 = uVar7 + 1 >> 1;
          sVar9 = (size_t)(uVar8 + uVar7);
          if (1000000000 - uVar8 < uVar7) {
            sVar9 = 1000000000;
          }
        }
        pxVar5 = (xmlChar *)(*xmlRealloc)(pxVar4,sVar9);
        if (pxVar5 == (xmlChar *)0x0) {
          xmlCtxtErrMemory(ctxt);
          pxVar5 = pxVar4;
          goto LAB_0013045a;
        }
      }
      pxVar5[__n] = bVar2;
      __n = __n + 1;
      bVar2 = *cur;
      pxVar4 = pxVar5;
    }
    pxVar4[__n & 0xffffffff] = '\0';
    uVar10 = __n;
  }
  if ((bVar2 == 0x3a) && (*cur == 0)) {
    if (pxVar4 != (xmlChar *)0x0) {
      (*xmlFree)(pxVar4);
    }
    goto LAB_0013005f;
  }
  if (pxVar4 == (xmlChar *)0x0) {
    pxVar5 = xmlStrndup(buf,(int)uVar10);
    if (pxVar5 == (xmlChar *)0x0) {
LAB_00130269:
      xmlCtxtErrMemory(ctxt);
      return (xmlChar *)0x0;
    }
  }
  else {
    uVar7 = 100;
    pxVar5 = pxVar4;
  }
  if (bVar2 != 0x3a) {
    return pxVar5;
  }
  bVar2 = *cur;
  if (bVar2 == 0) {
    pxVar4 = xmlStrndup("",0);
    if (pxVar4 != (xmlChar *)0x0) {
      *prefixOut = pxVar5;
      return pxVar4;
    }
    goto LAB_0013045a;
  }
  if (((0x19 < (byte)((bVar2 & 0xdf) + 0xbf)) && (bVar2 != 0x3a)) && (bVar2 != 0x5f)) {
    uVar8 = xmlStringCurrentChar(ctxt,cur,&l);
    if ((int)uVar8 < 0x100) {
      if ((((0x16 < uVar8 - 0xc0) && ((0x19 < (uVar8 & 0xffffffdf) - 0x41 && (uVar8 != 0x5f)))) &&
          ((int)uVar8 < 0xf8)) && (0x1e < uVar8 - 0xd8)) {
LAB_00130330:
        xmlFatalErrMsgStr(ctxt,XML_NS_ERR_QNAME,"Name %s is not XML Namespace compliant\n",name);
      }
    }
    else {
      iVar3 = xmlCharInRange(uVar8,&xmlIsBaseCharGroup);
      if ((iVar3 == 0) &&
         ((uVar8 - 0x302a < 0xfffffff7 && uVar8 - 0x9fa6 < 0xffffae5a) && uVar8 != 0x3007))
      goto LAB_00130330;
    }
  }
  sVar9 = 0;
  for (uVar10 = 0; (bVar2 != 0 && ((long)uVar10 < (long)(int)uVar7)); uVar10 = uVar10 + 1) {
    buf[uVar10] = bVar2;
    bVar2 = cur[uVar10 + 1];
    sVar9 = sVar9 + 2;
  }
  if ((long)uVar10 < (long)(int)uVar7) {
    pxVar4 = xmlStrndup(buf,(int)uVar10);
    if (pxVar4 != (xmlChar *)0x0) {
LAB_0013047a:
      *prefixOut = pxVar5;
      return pxVar4;
    }
  }
  else {
    pxVar4 = (xmlChar *)(*xmlMalloc)(sVar9);
    if (pxVar4 != (xmlChar *)0x0) {
      memcpy(pxVar4,buf,uVar10);
      while (bVar2 != 0) {
        uVar7 = (uint)sVar9;
        pxVar6 = pxVar4;
        if ((int)uVar7 < (int)uVar10 + 10) {
          sVar9 = 1;
          if (0 < (int)uVar7) {
            if (999999999 < uVar7) goto LAB_001302d9;
            uVar8 = uVar7 + 1 >> 1;
            sVar9 = (size_t)(uVar8 + uVar7);
            if (1000000000 - uVar8 < uVar7) {
              sVar9 = 1000000000;
            }
          }
          pxVar6 = (xmlChar *)(*xmlRealloc)(pxVar4,sVar9);
          if (pxVar6 == (xmlChar *)0x0) {
            xmlCtxtErrMemory(ctxt);
            (*xmlFree)(pxVar5);
            (*xmlFree)(pxVar4);
            return (xmlChar *)0x0;
          }
        }
        pxVar6[uVar10] = bVar2;
        lVar1 = uVar10 + 1;
        uVar10 = uVar10 + 1;
        pxVar4 = pxVar6;
        bVar2 = cur[lVar1];
      }
      pxVar4[uVar10 & 0xffffffff] = '\0';
      goto LAB_0013047a;
    }
    xmlCtxtErrMemory(ctxt);
  }
LAB_0013045a:
  (*xmlFree)(pxVar5);
  return (xmlChar *)0x0;
LAB_001302d9:
  xmlCtxtErrMemory(ctxt);
  pxVar5 = pxVar4;
  goto LAB_0013045a;
}

Assistant:

xmlChar *
xmlSplitQName(xmlParserCtxtPtr ctxt, const xmlChar *name, xmlChar **prefixOut) {
    xmlChar buf[XML_MAX_NAMELEN + 5];
    xmlChar *buffer = NULL;
    int len = 0;
    int max = XML_MAX_NAMELEN;
    xmlChar *ret = NULL;
    xmlChar *prefix;
    const xmlChar *cur = name;
    int c;

    if (prefixOut == NULL) return(NULL);
    *prefixOut = NULL;

    if (cur == NULL) return(NULL);

    /* nasty but well=formed */
    if (cur[0] == ':')
	return(xmlStrdup(name));

    c = *cur++;
    while ((c != 0) && (c != ':') && (len < max)) { /* tested bigname.xml */
	buf[len++] = c;
	c = *cur++;
    }
    if (len >= max) {
	/*
	 * Okay someone managed to make a huge name, so he's ready to pay
	 * for the processing speed.
	 */
	max = len * 2;

	buffer = xmlMalloc(max);
	if (buffer == NULL) {
	    xmlErrMemory(ctxt);
	    return(NULL);
	}
	memcpy(buffer, buf, len);
	while ((c != 0) && (c != ':')) { /* tested bigname.xml */
	    if (len + 10 > max) {
	        xmlChar *tmp;
                int newSize;

                newSize = xmlGrowCapacity(max, 1, 1, XML_MAX_ITEMS);
                if (newSize < 0) {
		    xmlErrMemory(ctxt);
		    xmlFree(buffer);
		    return(NULL);
                }
		tmp = xmlRealloc(buffer, newSize);
		if (tmp == NULL) {
		    xmlErrMemory(ctxt);
		    xmlFree(buffer);
		    return(NULL);
		}
		buffer = tmp;
		max = newSize;
	    }
	    buffer[len++] = c;
	    c = *cur++;
	}
	buffer[len] = 0;
    }

    if ((c == ':') && (*cur == 0)) {
        if (buffer != NULL)
	    xmlFree(buffer);
	return(xmlStrdup(name));
    }

    if (buffer == NULL) {
	ret = xmlStrndup(buf, len);
        if (ret == NULL) {
	    xmlErrMemory(ctxt);
	    return(NULL);
        }
    } else {
	ret = buffer;
	buffer = NULL;
	max = XML_MAX_NAMELEN;
    }


    if (c == ':') {
	c = *cur;
        prefix = ret;
	if (c == 0) {
	    ret = xmlStrndup(BAD_CAST "", 0);
            if (ret == NULL) {
                xmlFree(prefix);
                return(NULL);
            }
            *prefixOut = prefix;
            return(ret);
	}
	len = 0;

	/*
	 * Check that the first character is proper to start
	 * a new name
	 */
	if (!(((c >= 0x61) && (c <= 0x7A)) ||
	      ((c >= 0x41) && (c <= 0x5A)) ||
	      (c == '_') || (c == ':'))) {
	    int l;
	    int first = CUR_SCHAR(cur, l);

	    if (!IS_LETTER(first) && (first != '_')) {
		xmlFatalErrMsgStr(ctxt, XML_NS_ERR_QNAME,
			    "Name %s is not XML Namespace compliant\n",
				  name);
	    }
	}
	cur++;

	while ((c != 0) && (len < max)) { /* tested bigname2.xml */
	    buf[len++] = c;
	    c = *cur++;
	}
	if (len >= max) {
	    /*
	     * Okay someone managed to make a huge name, so he's ready to pay
	     * for the processing speed.
	     */
	    max = len * 2;

	    buffer = xmlMalloc(max);
	    if (buffer == NULL) {
	        xmlErrMemory(ctxt);
                xmlFree(prefix);
		return(NULL);
	    }
	    memcpy(buffer, buf, len);
	    while (c != 0) { /* tested bigname2.xml */
		if (len + 10 > max) {
		    xmlChar *tmp;
                    int newSize;

                    newSize = xmlGrowCapacity(max, 1, 1, XML_MAX_ITEMS);
                    if (newSize < 0) {
                        xmlErrMemory(ctxt);
                        xmlFree(buffer);
                        return(NULL);
                    }
		    tmp = xmlRealloc(buffer, newSize);
		    if (tmp == NULL) {
			xmlErrMemory(ctxt);
                        xmlFree(prefix);
			xmlFree(buffer);
			return(NULL);
		    }
		    buffer = tmp;
                    max = newSize;
		}
		buffer[len++] = c;
		c = *cur++;
	    }
	    buffer[len] = 0;
	}

	if (buffer == NULL) {
	    ret = xmlStrndup(buf, len);
            if (ret == NULL) {
                xmlFree(prefix);
                return(NULL);
            }
	} else {
	    ret = buffer;
	}

        *prefixOut = prefix;
    }

    return(ret);
}